

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O0

float __thiscall Imath_3_2::Vec3<float>::length(Vec3<float> *this)

{
  Vec3<float> *in_RDI;
  float fVar1;
  float fVar2;
  double dVar3;
  Vec3<float> *in_stack_00000008;
  float length2;
  undefined4 local_4;
  
  fVar1 = dot(in_RDI,in_RDI);
  fVar2 = std::numeric_limits<float>::min();
  if (fVar2 * 2.0 <= fVar1) {
    dVar3 = std::sqrt((double)(ulong)(uint)fVar1);
    local_4 = SUB84(dVar3,0);
  }
  else {
    local_4 = lengthTiny(in_stack_00000008);
  }
  return local_4;
}

Assistant:

IMATH_HOSTDEVICE inline T
Vec3<T>::length () const IMATH_NOEXCEPT
{
    T length2 = dot (*this);

    if (IMATH_UNLIKELY (length2 < T (2) * std::numeric_limits<T>::min ()))
        return lengthTiny ();

    return std::sqrt (length2);
}